

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void xy_y_convolve_4tap_16x2_half_pelavx2(int16_t *src,__m256i *s_256,__m256i *coeffs,__m256i *r)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  __m256i s1;
  __m256i s1_00;
  __m256i s0;
  __m256i s0_00;
  undefined8 *puVar4;
  undefined8 *puVar5;
  __m256i *in_RCX;
  undefined8 in_RDX;
  undefined1 (*in_RSI) [32];
  long in_RDI;
  __m256i a_256 [2];
  __m256i *in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  longlong in_stack_fffffffffffffed0;
  
  puVar4 = (undefined8 *)(in_RDI + 0x60);
  uVar1 = *(undefined8 *)(in_RDI + 0x68);
  uVar2 = *(undefined8 *)(in_RDI + 0x70);
  uVar3 = *(undefined8 *)(in_RDI + 0x78);
  *(undefined8 *)in_RSI[3] = *puVar4;
  *(undefined8 *)(in_RSI[3] + 8) = uVar1;
  *(undefined8 *)(in_RSI[3] + 0x10) = uVar2;
  *(undefined8 *)(in_RSI[3] + 0x18) = uVar3;
  puVar5 = (undefined8 *)(in_RDI + 0x80);
  uVar1 = *(undefined8 *)(in_RDI + 0x88);
  uVar2 = *(undefined8 *)(in_RDI + 0x90);
  uVar3 = *(undefined8 *)(in_RDI + 0x98);
  *(undefined8 *)in_RSI[4] = *puVar5;
  *(undefined8 *)(in_RSI[4] + 8) = uVar1;
  *(undefined8 *)(in_RSI[4] + 0x10) = uVar2;
  *(undefined8 *)(in_RSI[4] + 0x18) = uVar3;
  vpaddw_avx2(*in_RSI,in_RSI[3]);
  vpaddw_avx2(in_RSI[1],in_RSI[2]);
  s0[1] = in_stack_fffffffffffffec0;
  s0[0] = (longlong)puVar4;
  s0[2] = in_stack_fffffffffffffec8;
  s0[3] = in_stack_fffffffffffffed0;
  s1[1] = (longlong)in_RSI;
  s1[0] = in_RDX;
  s1[2] = in_RDI;
  s1[3] = (longlong)puVar5;
  xy_y_convolve_2tap_16_avx2(s0,s1,in_RCX,in_stack_fffffffffffffe88);
  vpaddw_avx2(in_RSI[1],in_RSI[4]);
  vpaddw_avx2(in_RSI[2],in_RSI[3]);
  s0_00[1] = *(undefined8 *)in_RSI[3];
  s0_00[0] = (longlong)puVar4;
  s0_00[2] = *(undefined8 *)(in_RSI[3] + 8);
  s0_00[3] = *(longlong *)(in_RSI[3] + 0x10);
  s1_00[1] = (longlong)in_RSI;
  s1_00[0] = in_RDX;
  s1_00[2] = in_RDI;
  s1_00[3] = (longlong)puVar5;
  xy_y_convolve_2tap_16_avx2(s0_00,s1_00,in_RCX,in_stack_fffffffffffffe88);
  uVar1 = *(undefined8 *)(in_RSI[2] + 8);
  uVar2 = *(undefined8 *)(in_RSI[2] + 0x10);
  uVar3 = *(undefined8 *)(in_RSI[2] + 0x18);
  *(undefined8 *)*in_RSI = *(undefined8 *)in_RSI[2];
  *(undefined8 *)(*in_RSI + 8) = uVar1;
  *(undefined8 *)(*in_RSI + 0x10) = uVar2;
  *(undefined8 *)(*in_RSI + 0x18) = uVar3;
  uVar1 = *(undefined8 *)(in_RSI[3] + 8);
  uVar2 = *(undefined8 *)(in_RSI[3] + 0x10);
  uVar3 = *(undefined8 *)(in_RSI[3] + 0x18);
  *(undefined8 *)in_RSI[1] = *(undefined8 *)in_RSI[3];
  *(undefined8 *)(in_RSI[1] + 8) = uVar1;
  *(undefined8 *)(in_RSI[1] + 0x10) = uVar2;
  *(undefined8 *)(in_RSI[1] + 0x18) = uVar3;
  uVar1 = *(undefined8 *)(in_RSI[4] + 8);
  uVar2 = *(undefined8 *)(in_RSI[4] + 0x10);
  uVar3 = *(undefined8 *)(in_RSI[4] + 0x18);
  *(undefined8 *)in_RSI[2] = *(undefined8 *)in_RSI[4];
  *(undefined8 *)(in_RSI[2] + 8) = uVar1;
  *(undefined8 *)(in_RSI[2] + 0x10) = uVar2;
  *(undefined8 *)(in_RSI[2] + 0x18) = uVar3;
  return;
}

Assistant:

static inline void xy_y_convolve_4tap_16x2_half_pelavx2(
    const int16_t *const src, __m256i s_256[5], const __m256i coeffs[1],
    __m256i r[4]) {
  __m256i a_256[2];

  s_256[3] = _mm256_loadu_si256((__m256i *)(src + 3 * 16));
  s_256[4] = _mm256_loadu_si256((__m256i *)(src + 4 * 16));

  a_256[0] = _mm256_add_epi16(s_256[0], s_256[3]);
  a_256[1] = _mm256_add_epi16(s_256[1], s_256[2]);
  xy_y_convolve_2tap_16_avx2(a_256[0], a_256[1], coeffs, r + 0);

  a_256[0] = _mm256_add_epi16(s_256[1], s_256[4]);
  a_256[1] = _mm256_add_epi16(s_256[2], s_256[3]);
  xy_y_convolve_2tap_16_avx2(a_256[0], a_256[1], coeffs, r + 2);

  s_256[0] = s_256[2];
  s_256[1] = s_256[3];
  s_256[2] = s_256[4];
}